

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O2

UINT8 YM2612_Read(ym2612_ *YM2612,UINT8 adr)

{
  return (UINT8)YM2612->Status;
}

Assistant:

UINT8 YM2612_Read(ym2612_ *YM2612, UINT8 adr)
{
#if 0
  static int cnt = 0;

  if (cnt++ == 50)
  {
    cnt = 0;
    return YM2612->Status;
  }
  else return YM2612->Status | 0x80;
#endif

  /**
   * READ DATA is the same for all four addresses.
   * Format: [BUSY X X X X X OVRA OVRB]
   * BUSY: If 1, YM2612 is busy and cannot accept new data.
   * OVRA: If 1, timer A has overflowed.
   * OVRB: If 1, timer B has overflowed.
   */
  return (UINT8)YM2612->Status;
}